

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_dr_flac *
ma_dr_flac_open_memory(void *pData,size_t dataSize,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac_bs *pmVar1;
  ma_dr_flac *pmVar2;
  ma_dr_flac__memory_stream memoryStream;
  ma_uint8 *local_18;
  size_t sStack_10;
  size_t local_8;
  
  local_8 = 0;
  local_18 = (ma_uint8 *)pData;
  sStack_10 = dataSize;
  pmVar2 = ma_dr_flac_open(ma_dr_flac__on_read_memory,ma_dr_flac__on_seek_memory,&local_18,
                           pAllocationCallbacks);
  if (pmVar2 != (ma_dr_flac *)0x0) {
    (pmVar2->memoryStream).currentReadPos = local_8;
    (pmVar2->memoryStream).data = local_18;
    (pmVar2->memoryStream).dataSize = sStack_10;
    if (pmVar2->container == ma_dr_flac_container_ogg) {
      pmVar1 = (ma_dr_flac_bs *)pmVar2->_oggbs;
    }
    else {
      pmVar1 = &pmVar2->bs;
    }
    pmVar1->pUserData = &pmVar2->memoryStream;
  }
  return pmVar2;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_memory(const void* pData, size_t dataSize, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac__memory_stream memoryStream;
    ma_dr_flac* pFlac;
    memoryStream.data = (const ma_uint8*)pData;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;
    pFlac = ma_dr_flac_open(ma_dr_flac__on_read_memory, ma_dr_flac__on_seek_memory, &memoryStream, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    pFlac->memoryStream = memoryStream;
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg)
    {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        oggbs->pUserData = &pFlac->memoryStream;
    }
    else
#endif
    {
        pFlac->bs.pUserData = &pFlac->memoryStream;
    }
    return pFlac;
}